

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O0

pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> __thiscall
miniros::master::ParameterStorage::findParameter(ParameterStorage *this,Path *name,bool create)

{
  bool bVar1;
  size_t sVar2;
  Type *pTVar3;
  byte in_DL;
  XmlRpcValue *in_RDI;
  RpcValue *next_1;
  RpcValue *next;
  string key;
  size_t i;
  RpcValue *parent;
  RpcValue *current;
  string *in_stack_ffffffffffffff08;
  ulong uVar4;
  Path *in_stack_ffffffffffffff10;
  Path *in_stack_ffffffffffffff28;
  XmlRpcValue *this_00;
  XmlRpcValue *in_stack_ffffffffffffff50;
  Path *in_stack_ffffffffffffff60;
  Path *in_stack_ffffffffffffff68;
  XmlRpcValue local_60 [2];
  ulong local_40;
  Path *local_38;
  Path *local_30;
  byte local_21;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> local_10;
  
  local_21 = in_DL & 1;
  sVar2 = names::Path::size(in_stack_ffffffffffffff10);
  if (sVar2 == 0) {
    ::std::pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*>::
    pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*,_true>(&local_10);
  }
  else {
    local_30 = (Path *)&in_RDI[2]._value;
    local_38 = (Path *)0x0;
    for (local_40 = 0; uVar4 = local_40, sVar2 = names::Path::size(in_stack_ffffffffffffff10),
        uVar4 < sVar2; local_40 = local_40 + 1) {
      this_00 = local_60;
      names::Path::str_abi_cxx11_
                (in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      bVar1 = XmlRpc::XmlRpcValue::hasMember(this_00,(string *)in_stack_ffffffffffffff28);
      if (bVar1) {
        in_stack_ffffffffffffff28 =
             (Path *)XmlRpc::XmlRpcValue::operator[]
                               ((XmlRpcValue *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        local_38 = local_30;
        local_30 = in_stack_ffffffffffffff28;
LAB_005519d1:
        bVar1 = false;
      }
      else {
        if ((local_21 & 1) != 0) {
          pTVar3 = XmlRpc::XmlRpcValue::getType((XmlRpcValue *)local_30);
          if (*pTVar3 != TypeStruct) {
            XmlRpc::XmlRpcValue::Dict();
            XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff50,in_RDI);
            XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x5518f8);
          }
          XmlRpc::XmlRpcValue::Dict();
          XmlRpc::XmlRpcValue::operator[]
                    ((XmlRpcValue *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff50,in_RDI);
          XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x551960);
          in_stack_ffffffffffffff10 =
               (Path *)XmlRpc::XmlRpcValue::operator[]
                                 ((XmlRpcValue *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                                 );
          local_38 = local_30;
          in_stack_ffffffffffffff60 = in_stack_ffffffffffffff10;
          local_30 = in_stack_ffffffffffffff10;
          goto LAB_005519d1;
        }
        bVar1 = true;
      }
      ::std::__cxx11::string::~string((string *)local_60);
      if (bVar1) break;
    }
    uVar4 = local_40;
    sVar2 = names::Path::size(in_stack_ffffffffffffff10);
    if (uVar4 == sVar2) {
      ::std::pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*>::
      pair<XmlRpc::XmlRpcValue_*&,_XmlRpc::XmlRpcValue_*&,_true>
                (&local_10,(XmlRpcValue **)&local_30,(XmlRpcValue **)&local_38);
    }
    else {
      ::std::pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*>::
      pair<std::nullptr_t,_XmlRpc::XmlRpcValue_*&,_true>
                (&local_10,(void **)&stack0xffffffffffffff50,(XmlRpcValue **)&local_38);
    }
  }
  return local_10;
}

Assistant:

std::pair<ParameterStorage::RpcValue*, ParameterStorage::RpcValue*> ParameterStorage::findParameter(const names::Path& name, bool create) const
{
  if (name.size() == 0)
    return {};

  RpcValue* current = const_cast<RpcValue*>(&m_parameterRoot);
  RpcValue* parent = nullptr;

  size_t i = 0;
  for (; i < name.size(); i++) {
    std::string key = name.str(i);
    if (current->hasMember(key)) {
      RpcValue* next = &(*current)[key];
      parent = current;
      current = next;
    }
    else if (create) {
      if (current->getType() != RpcValue::TypeStruct)
        *current = RpcValue::Dict();
      // New value. We are making it dict by default.
      // It is ok for final new value to be dict: setParam will override it anyway.
      (*current)[key] = RpcValue::Dict();
      RpcValue* next = &(*current)[key];

      parent = current;
      current = next;
    } else
      break;
  }

  if (i == name.size()) {
    // current contains a pointer to the needed element.
    return {current, parent};
  }
  return {nullptr, parent};
}